

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_segtree.cpp
# Opt level: O1

Segtree * __thiscall Segtree::rangeUpdate(Segtree *this,int fr,int to,ll x)

{
  int iVar1;
  int iVar2;
  Segtree *pSVar3;
  Segtree *pSVar4;
  Segtree *pSVar5;
  long lVar6;
  
  iVar1 = this->r;
  if ((fr < iVar1) && (iVar2 = this->l, iVar2 < to)) {
    pSVar3 = (Segtree *)operator_new(0x20);
    lVar6 = this->val;
    if (to < iVar1 || iVar2 < fr) {
      pSVar4 = rangeUpdate(this->lson,fr,to,x);
      pSVar5 = rangeUpdate(this->rson,fr,to,x);
    }
    else {
      lVar6 = lVar6 + x;
      pSVar4 = this->lson;
      pSVar5 = this->rson;
    }
    pSVar3->l = iVar2;
    pSVar3->r = iVar1;
    pSVar3->val = lVar6;
    pSVar3->lson = pSVar4;
    pSVar3->rson = pSVar5;
    this = pSVar3;
  }
  return this;
}

Assistant:

Segtree* rangeUpdate(int fr, int to, ll x) {
        if (fr >= r || l >= to) return this; // Range is not in the segment
        if (fr <= l && to >= r) { // Range is completely in the segment
            return new Segtree(l, r, val + x, lson, rson);
        }
        return new Segtree(l, r, val,
                           lson->rangeUpdate(fr, to, x),
                           rson->rangeUpdate(fr, to, x));
    }